

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageStore.cpp
# Opt level: O0

void __thiscall
FIX::MessageStoreExceptionWrapper::reset
          (MessageStoreExceptionWrapper *this,UtcTimeStamp *now,bool *threw,IOException *ex)

{
  IOException *e;
  IOException *ex_local;
  bool *threw_local;
  UtcTimeStamp *now_local;
  MessageStoreExceptionWrapper *this_local;
  
  *threw = false;
  (**(code **)(**(long **)this + 0x58))(*(long **)this,now);
  return;
}

Assistant:

void MessageStoreExceptionWrapper::reset(const UtcTimeStamp &now, bool &threw, IOException &ex) {
  threw = false;
  try {
    m_pStore->reset(now);
  } catch (IOException &e) {
    threw = true;
    ex = e;
  }
}